

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O3

void __thiscall
QtMWidgets::PageControlPrivate::updateButtonsInfo(PageControlPrivate *this,int width)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  if (width < 1) {
    lVar1 = *(long *)&this->q->field_0x20;
    width = (*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1;
  }
  this->widgetWidth = width;
  iVar2 = width / this->buttonSize;
  this->countInOneLine = iVar2;
  if (1 < iVar2) {
    iVar3 = this->count % iVar2;
    this->countInLastLine = iVar3;
    this->linesCount = (uint)(0 < iVar3) + this->count / iVar2;
    if (iVar3 == 0) {
      this->countInLastLine = iVar2;
      return;
    }
  }
  return;
}

Assistant:

void
PageControlPrivate::updateButtonsInfo( int width )
{
	if( width <= 0 )
		widgetWidth = q->rect().width();
	else
		widgetWidth = width;

	countInOneLine = widgetWidth / buttonSize;

	if( countInOneLine > 1 )
	{
		countInLastLine = count % countInOneLine;

		linesCount = count / countInOneLine + ( countInLastLine > 0 ? 1 : 0 );

		if( countInLastLine == 0 )
			countInLastLine = countInOneLine;
	}
}